

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int invalidateTempStorage(Parse *pParse)

{
  sqlite3 *db;
  Btree *p;
  int iVar1;
  
  db = pParse->db;
  p = db->aDb[1].pBt;
  iVar1 = 0;
  if (p != (Btree *)0x0) {
    if ((db->autoCommit == '\0') || (p->inTrans != '\0')) {
      sqlite3ErrorMsg(pParse,"temporary storage cannot be changed from within a transaction");
      iVar1 = 1;
    }
    else {
      sqlite3BtreeClose(p);
      db->aDb[1].pBt = (Btree *)0x0;
      sqlite3ResetAllSchemasOfConnection(db);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int invalidateTempStorage(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt!=0 ){
    if( !db->autoCommit || sqlite3BtreeIsInReadTrans(db->aDb[1].pBt) ){
      sqlite3ErrorMsg(pParse, "temporary storage cannot be changed "
        "from within a transaction");
      return SQLITE_ERROR;
    }
    sqlite3BtreeClose(db->aDb[1].pBt);
    db->aDb[1].pBt = 0;
    sqlite3ResetAllSchemasOfConnection(db);
  }
  return SQLITE_OK;
}